

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_3::DBIter::FindNextUserEntry(DBIter *this,bool skipping,string *skip)

{
  bool bVar1;
  int iVar2;
  ParsedInternalKey ikey;
  ParsedInternalKey local_60;
  pointer local_40;
  size_type local_38;
  
  do {
    local_60.user_key.data_ = "";
    local_60.user_key.size_ = 0;
    bVar1 = ParseKey(this,&local_60);
    if ((bVar1) && (local_60.sequence <= this->sequence_)) {
      if (local_60.type == kTypeValue) {
        if ((skipping & 1U) == 0) {
LAB_0010f12a:
          this->valid_ = true;
          (this->saved_key_)._M_string_length = 0;
          *(this->saved_key_)._M_dataplus._M_p = '\0';
          return;
        }
        local_40 = (skip->_M_dataplus)._M_p;
        local_38 = skip->_M_string_length;
        iVar2 = (*this->user_comparator_->_vptr_Comparator[2])
                          (this->user_comparator_,&local_60,&local_40);
        skipping = true;
        if (0 < iVar2) goto LAB_0010f12a;
      }
      else if (local_60.type == kTypeDeletion) {
        std::__cxx11::string::assign((char *)skip,(ulong)local_60.user_key.data_);
        skipping = true;
      }
    }
    (*this->iter_->_vptr_Iterator[6])();
    iVar2 = (*this->iter_->_vptr_Iterator[2])();
    if ((char)iVar2 == '\0') {
      (this->saved_key_)._M_string_length = 0;
      *(this->saved_key_)._M_dataplus._M_p = '\0';
      this->valid_ = false;
      return;
    }
  } while( true );
}

Assistant:

void DBIter::FindNextUserEntry(bool skipping, std::string* skip) {
  // Loop until we hit an acceptable entry to yield
  assert(iter_->Valid());
  assert(direction_ == kForward);
  do {
    ParsedInternalKey ikey;
    if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
      switch (ikey.type) {
        case kTypeDeletion:
          // Arrange to skip all upcoming entries for this key since
          // they are hidden by this deletion.
          SaveKey(ikey.user_key, skip);
          skipping = true;
          break;
        case kTypeValue:
          if (skipping &&
              user_comparator_->Compare(ikey.user_key, *skip) <= 0) {
            // Entry hidden
          } else {
            valid_ = true;
            saved_key_.clear();
            return;
          }
          break;
      }
    }
    iter_->Next();
  } while (iter_->Valid());
  saved_key_.clear();
  valid_ = false;
}